

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_conn_upkeep(Curl_easy *data,connectdata *conn,curltime *now)

{
  _func_uint_Curl_easy_ptr_connectdata_ptr_uint *p_Var1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  int iVar6;
  undefined4 uVar7;
  uint uVar8;
  timediff_t tVar9;
  CURLcode CVar10;
  curltime newer;
  curltime older;
  
  uVar2 = now->tv_sec;
  uVar3 = now->tv_usec;
  newer.tv_usec = uVar3;
  newer.tv_sec = uVar2;
  uVar4 = (conn->keepalive).tv_sec;
  uVar5 = (conn->keepalive).tv_usec;
  older.tv_usec = uVar5;
  older.tv_sec = uVar4;
  newer._12_4_ = 0;
  older._12_4_ = 0;
  tVar9 = Curl_timediff(newer,older);
  CVar10 = CURLE_OK;
  if ((data->set).upkeep_interval_ms < tVar9) {
    Curl_attach_connection(data,conn);
    p_Var1 = conn->handler->connection_check;
    if (p_Var1 == (_func_uint_Curl_easy_ptr_connectdata_ptr_uint *)0x0) {
      CVar10 = Curl_conn_keep_alive(data,conn,0);
    }
    else {
      uVar8 = (*p_Var1)(data,conn,2);
      CVar10 = -(uVar8 & 1) & CURLE_RECV_ERROR;
    }
    Curl_detach_connection(data);
    iVar6 = now->tv_usec;
    uVar7 = *(undefined4 *)&now->field_0xc;
    (conn->keepalive).tv_sec = now->tv_sec;
    (conn->keepalive).tv_usec = iVar6;
    *(undefined4 *)&(conn->keepalive).field_0xc = uVar7;
  }
  return CVar10;
}

Assistant:

CURLcode Curl_conn_upkeep(struct Curl_easy *data,
                          struct connectdata *conn,
                          struct curltime *now)
{
  CURLcode result = CURLE_OK;
  if(Curl_timediff(*now, conn->keepalive) <= data->set.upkeep_interval_ms)
    return result;

  /* briefly attach for action */
  Curl_attach_connection(data, conn);
  if(conn->handler->connection_check) {
    /* Do a protocol-specific keepalive check on the connection. */
    unsigned int rc;
    rc = conn->handler->connection_check(data, conn, CONNCHECK_KEEPALIVE);
    if(rc & CONNRESULT_DEAD)
      result = CURLE_RECV_ERROR;
  }
  else {
    /* Do the generic action on the FIRSTSOCKET filter chain */
    result = Curl_conn_keep_alive(data, conn, FIRSTSOCKET);
  }
  Curl_detach_connection(data);

  conn->keepalive = *now;
  return result;
}